

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertorsTestCase.cpp
# Opt level: O2

void __thiscall
SuiteFieldConvertorsTests::TestcharConvertTo::TestcharConvertTo(TestcharConvertTo *this)

{
  UnitTest::Test::Test
            (&this->super_Test,"charConvertTo","FieldConvertorsTests",
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/FieldConvertorsTestCase.cpp"
             ,0xd0);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0031cad0;
  return;
}

Assistant:

TEST(charConvertTo)
{
  CHECK_EQUAL( "a", CharConvertor::convert( 'a' ) );
  CHECK_EQUAL( "1", CharConvertor::convert( '1' ) );
  CHECK_EQUAL( "F", CharConvertor::convert( 'F' ) );
  CHECK_EQUAL( "", CharConvertor::convert( 0 ) );
  CHECK_THROW( CharConvertor::convert( "11" ), FieldConvertError );
  CHECK_THROW( CharConvertor::convert( "1 " ), FieldConvertError );
}